

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

parasail_sequences_t * parasail_sequences_from_file(char *filename)

{
  kstring_t *str;
  kstring_t *str_00;
  undefined8 *__ptr;
  int iVar1;
  int iVar2;
  uint uVar3;
  parasail_sequences_t *ppVar4;
  parasail_sequence_t *ppVar5;
  int *piVar6;
  kstring_t *str_01;
  kstream_t *ks;
  uchar *puVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint local_b4;
  size_t local_b0;
  ulong local_a8;
  parasail_sequences_t *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  parasail_sequence_t *local_78;
  ulong local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  FILE *local_48;
  kstring_t *local_40;
  int *local_38;
  
  ppVar4 = (parasail_sequences_t *)malloc(0x30);
  if (ppVar4 == (parasail_sequences_t *)0x0) {
    perror("malloc");
    fwrite("parasail_sequences_from_file: failed\n",0x25,1,_stderr);
    return (parasail_sequences_t *)0x0;
  }
  ppVar5 = (parasail_sequence_t *)malloc(64000);
  if (ppVar5 != (parasail_sequence_t *)0x0) {
    local_78 = ppVar5;
    iVar1 = strncmp("stdin",filename,5);
    local_48 = _stdin;
    if (iVar1 != 0) {
      piVar6 = __errno_location();
      *piVar6 = 0;
      local_48 = fopen(filename,"r");
      if (local_48 == (FILE *)0x0) {
        perror("fopen");
        fwrite("parasail_sequences_from_file: failed\n",0x25,1,_stderr);
        free(local_78);
        goto LAB_00456ab2;
      }
    }
    local_a0 = ppVar4;
    iVar2 = fileno(local_48);
    str_01 = (kstring_t *)calloc(1,0x70);
    ks = (kstream_t *)calloc(1,0x18);
    ks->f = iVar2;
    puVar7 = (uchar *)malloc(0x4000);
    ks->buf = puVar7;
    str_01[4].m = (size_t)ks;
    str = str_01 + 3;
    str_00 = str_01 + 2;
    local_40 = str_01 + 1;
    local_70 = 1000;
    local_58 = 0.0;
    uStack_50 = 0;
    iVar2 = 0;
    local_a8 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
    local_98 = 0.0;
    local_88 = 0.0;
    local_b0 = 0;
    do {
      uStack_80 = 0;
      uStack_90 = 0;
      if (iVar2 == 0) {
        do {
          uVar3 = ks_getc(ks);
          if ((int)uVar3 < 0) goto LAB_004568ed;
        } while ((uVar3 != 0x40) && (uVar3 != 0x3e));
        *(uint *)&str_01[4].l = uVar3;
        local_b4 = uVar3;
      }
      str_01[3].l = 0;
      str_01[2].l = 0;
      str_01[1].l = 0;
      iVar2 = ks_getuntil(ks,0,str_01,(int *)&local_b4);
      if (iVar2 < 0) {
LAB_00456908:
        iVar2 = 0;
        uVar11 = local_a8;
        goto LAB_0045691c;
      }
      if (local_b4 != 10) {
        ks_getuntil(ks,2,local_40,(int *)0x0);
      }
      if (str_01[2].s == (char *)0x0) {
        str_01[2].m = 0x100;
        pcVar8 = (char *)malloc(0x100);
        str_01[2].s = pcVar8;
      }
      while (local_b4 = ks_getc(ks), -1 < (int)local_b4) {
        if (local_b4 != 10) {
          if (local_b4 == 0x2b) break;
          if ((local_b4 == 0x3e) || (local_b4 == 0x40)) {
            *(uint *)&str_01[4].l = local_b4;
            break;
          }
          sVar13 = str_01[2].l;
          str_01[2].l = sVar13 + 1;
          str_01[2].s[sVar13] = (char)local_b4;
          ks_getuntil2(ks,2,str_00,(int *)0x0,1);
        }
      }
      sVar13 = str_01[2].l;
      uVar12 = str_01[2].m;
      uVar11 = sVar13 + 1;
      pcVar8 = str_01[2].s;
      if (uVar12 <= uVar11) {
        uVar11 = uVar11 >> 1 | uVar11;
        uVar11 = uVar11 >> 2 | uVar11;
        uVar11 = uVar11 >> 4 | uVar11;
        uVar11 = uVar11 >> 8 | uVar11;
        uVar12 = (uVar11 >> 0x10 | uVar11) + 1;
        str_01[2].m = uVar12;
        pcVar8 = (char *)realloc(pcVar8,uVar12);
        str_01[2].s = pcVar8;
      }
      pcVar8[sVar13] = '\0';
      if (local_b4 == 0x2b) {
        if (str_01[3].m < uVar12) {
          str_01[3].m = uVar12;
          pcVar8 = (char *)realloc(str_01[3].s,uVar12);
          str_01[3].s = pcVar8;
        }
        do {
          local_b4 = ks_getc(ks);
          if ((int)local_b4 < 0) break;
        } while (local_b4 != 10);
        if (local_b4 == 0xffffffff) {
LAB_004568ed:
          iVar2 = 0;
          uVar11 = local_a8;
          ppVar4 = local_a0;
          if (str_01 == (kstring_t *)0x0) goto LAB_0045697b;
          goto LAB_0045691c;
        }
        do {
          iVar2 = ks_getuntil2(ks,2,str,(int *)0x0,1);
          if (iVar2 < 0) {
            sVar9 = str_00->l;
            sVar13 = str->l;
            break;
          }
          sVar13 = str->l;
          sVar9 = str_00->l;
          local_b4 = (uint)(sVar13 < sVar9);
        } while (sVar13 < sVar9);
        *(undefined4 *)&str_01[4].l = 0;
        if (sVar9 != sVar13) goto LAB_00456908;
      }
      if ((int)sVar13 < 0) goto LAB_00456908;
      local_38 = __errno_location();
      ppVar5 = local_78;
      uVar12 = local_a8;
      *local_38 = 0;
      sVar9 = str_01->l;
      local_78[local_a8].name.l = sVar9;
      sVar10 = str_01[1].l;
      local_78[local_a8].comment.l = sVar10;
      local_78[local_a8].seq.l = sVar13;
      local_78[local_a8].qual.l = str_01[3].l;
      local_78[local_a8].name.s = (char *)0x0;
      local_78[local_a8].comment.s = (char *)0x0;
      local_78[local_a8].seq.s = (char *)0x0;
      local_78[local_a8].qual.s = (char *)0x0;
      auVar20._8_4_ = (int)(sVar13 >> 0x20);
      auVar20._0_8_ = sVar13;
      auVar20._12_4_ = 0x45300000;
      dVar15 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0);
      dVar16 = dVar15;
      dVar18 = dVar15;
      if (local_a8 != 0) {
        dVar16 = local_98;
        if (dVar15 <= local_98) {
          dVar16 = dVar15;
        }
        dVar18 = local_88;
        if (local_88 <= dVar15) {
          dVar18 = dVar15;
        }
      }
      uVar11 = local_a8 + 1;
      dVar19 = dVar15 - local_58;
      auVar21._8_4_ = (int)(uVar11 >> 0x20);
      auVar21._0_8_ = uVar11;
      auVar21._12_4_ = 0x45300000;
      local_58 = local_58 +
                 dVar19 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0));
      local_68 = local_68 + (dVar15 - local_58) * dVar19;
      local_b0 = local_b0 + sVar13;
      local_98 = dVar16;
      local_88 = dVar18;
      if (sVar9 != 0) {
        pcVar8 = strdup_rpl(str_01->s);
        ppVar5[uVar12].name.s = pcVar8;
        if (pcVar8 != (char *)0x0) {
          sVar10 = ppVar5[uVar12].comment.l;
          goto LAB_0045682c;
        }
        pcVar8 = "strdup name";
LAB_00456b09:
        perror(pcVar8);
        uStack_80 = 0;
        uStack_90 = 0;
        iVar2 = 1;
        goto LAB_0045691c;
      }
LAB_0045682c:
      if (sVar10 != 0) {
        pcVar8 = strdup_rpl(str_01[1].s);
        ppVar5[uVar12].comment.s = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "strdup comment";
          goto LAB_00456b09;
        }
      }
      if (ppVar5[uVar12].seq.l != 0) {
        pcVar8 = strdup_rpl(str_01[2].s);
        ppVar5[uVar12].seq.s = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "strdup seq";
          goto LAB_00456b4c;
        }
      }
      if (ppVar5[uVar12].qual.l != 0) {
        pcVar8 = strdup_rpl(str_01[3].s);
        ppVar5[uVar12].qual.s = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "strdup qual";
LAB_00456b4c:
          perror(pcVar8);
          uStack_80 = 0;
          uStack_90 = 0;
          iVar2 = 1;
LAB_0045691c:
          ppVar4 = local_a0;
          free(str_01->s);
          free(str_01[1].s);
          free(str_01[2].s);
          free(str_01[3].s);
          __ptr = (undefined8 *)str_01[4].m;
          if (__ptr != (undefined8 *)0x0) {
            free((void *)*__ptr);
            free(__ptr);
          }
          free(str_01);
LAB_0045697b:
          sVar13 = local_b0;
          if (iVar1 != 0) {
            fclose(local_48);
          }
          ppVar4->seqs = local_78;
          ppVar4->l = local_a8;
          ppVar4->characters = sVar13;
          ppVar4->shortest =
               (long)local_98 >> 0x3f & (long)(local_98 - 9.223372036854776e+18) | (long)local_98;
          lVar14 = uVar11 - 1;
          auVar17._8_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar17._0_8_ = lVar14;
          auVar17._12_4_ = 0x45300000;
          ppVar4->longest =
               (long)local_88 >> 0x3f & (long)(local_88 - 9.223372036854776e+18) | (long)local_88;
          dVar16 = local_68 /
                   ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
          if (dVar16 < 0.0) {
            dVar16 = sqrt(dVar16);
          }
          else {
            dVar16 = SQRT(dVar16);
          }
          ppVar4->mean = (float)local_58;
          ppVar4->stddev = (float)dVar16;
          if (iVar2 != 0) {
            fwrite("parasail_sequences_from_file: failed\n",0x25,1,_stderr);
            if (iVar2 == 1) {
              ppVar4->l = local_a8 + 1;
            }
            parasail_sequences_free(ppVar4);
            return (parasail_sequences_t *)0x0;
          }
          return ppVar4;
        }
      }
      piVar6 = local_38;
      uVar12 = local_70;
      if (local_70 <= uVar11) {
        *local_38 = 0;
        ppVar5 = (parasail_sequence_t *)realloc(local_78,local_70 << 7);
        if (ppVar5 == (parasail_sequence_t *)0x0) {
          perror("realloc");
          iVar2 = 2;
          uStack_80 = 0;
          uStack_90 = 0;
          local_a8 = uVar11;
          goto LAB_0045691c;
        }
        local_70 = uVar12 * 2;
        *piVar6 = 0;
        local_78 = ppVar5;
      }
      ks = (kstream_t *)str_01[4].m;
      iVar2 = (int)str_01[4].l;
      local_a8 = uVar11;
    } while( true );
  }
  perror("malloc");
  fwrite("parasail_sequences_from_file: failed\n",0x25,1,_stderr);
LAB_00456ab2:
  free(ppVar4);
  return (parasail_sequences_t *)0x0;
}

Assistant:

parasail_sequences_t* parasail_sequences_from_file(const char *filename)
{
#if HAVE_ZLIB
    gzFile fp;
#else
    FILE* fp;
    int is_stdin = 0;
#endif
    kseq_t *seq = NULL;
    int l = 0;
    parasail_sequences_t *retval = NULL;
    parasail_sequence_t *sequences = NULL;
    unsigned long count = 0;
    unsigned long capacity = 1000;
    size_t chars = 0;
    stats_t stats;
    int error_during_kseq = 0;

    stats_clear(&stats);

    retval = (parasail_sequences_t*)malloc(sizeof(parasail_sequences_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        return NULL;
    }
    sequences = (parasail_sequence_t*)malloc(sizeof(parasail_sequence_t) * capacity);
    if (NULL == sequences) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        free(retval);
        return NULL;
    }

    /* check for stdin instead of a normal filename */
    if (0 == strncmp("stdin", filename, 5)) {
#if HAVE_ZLIB
        fp = gzdopen(fileno(stdin), "r");
        if (fp == Z_NULL) {
            perror("gzdopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = stdin;
        is_stdin = 1;
#endif
    }
    else {
        /* open the file */
        errno = 0;
#if HAVE_ZLIB
        fp = gzopen(filename, "r");
        if (fp == Z_NULL) {
            perror("gzopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = fopen(filename, "r");
        if (fp == NULL) {
            perror("fopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#endif
    }
    
    /* initialize kseq structures */
#if HAVE_ZLIB
    seq = kseq_init(fp);
#else
    seq = kseq_init(fileno(fp));
#endif

    /* parse file */
    while ((l = kseq_read(seq)) >= 0) {
        errno = 0;
        sequences[count].name.l = seq->name.l;
        sequences[count].comment.l = seq->comment.l;
        sequences[count].seq.l = seq->seq.l;
        sequences[count].qual.l = seq->qual.l;
        sequences[count].name.s = NULL;
        sequences[count].comment.s = NULL;
        sequences[count].seq.s = NULL;
        sequences[count].qual.s = NULL;

        stats_sample_value(&stats, seq->seq.l);
        chars += seq->seq.l;

        if (sequences[count].name.l) {
            sequences[count].name.s = strdup_rpl(seq->name.s);
            if (NULL == sequences[count].name.s) {
                perror("strdup name");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].comment.l) {
            sequences[count].comment.s = strdup_rpl(seq->comment.s);
            if (NULL == sequences[count].comment.s) {
                perror("strdup comment");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].seq.l) {
            sequences[count].seq.s = strdup_rpl(seq->seq.s);
            if (NULL == sequences[count].seq.s) {
                perror("strdup seq");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].qual.l) {
            sequences[count].qual.s = strdup_rpl(seq->qual.s);
            if (NULL == sequences[count].qual.s) {
                perror("strdup qual");
                error_during_kseq = 1;
                break;
            }
        }
        ++count;

        /* allocate more space for sequences if we ran out */
        if (count >= capacity) {
            parasail_sequence_t *new_sequences = NULL;
            capacity *= 2;
            errno = 0;
            new_sequences = (parasail_sequence_t*)realloc(sequences, sizeof(parasail_sequence_t) * capacity);
            if (NULL == new_sequences) {
                perror("realloc");
                error_during_kseq = 2;
                break;
            }
            sequences = new_sequences;
            errno = 0;
        }
    }
    kseq_destroy(seq);
#if HAVE_ZLIB
    gzclose(fp);
#else
    if (!is_stdin) {
        fclose(fp);
    }
#endif

    retval->seqs = sequences;
    retval->l = count;
    retval->characters = chars;
    retval->shortest = stats._min;
    retval->longest = stats._max;
    retval->mean = stats._mean;
    retval->stddev = stats_stddev(&stats);

    if (0 != error_during_kseq) {
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        if (1 == error_during_kseq) {
            retval->l++;
        }
        parasail_sequences_free(retval);
        return NULL;
    }

    return retval;
}